

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

lu_mem atomic(lua_State *L)

{
  global_State *g;
  GCObject *pGVar1;
  GCObject *pGVar2;
  lu_mem lVar3;
  lua_State *plVar4;
  lu_mem lVar5;
  long lVar6;
  long lVar7;
  UpVal *pUVar8;
  long lVar9;
  lua_State **pplVar10;
  long lVar11;
  ulong uVar12;
  
  g = L->l_G;
  pGVar1 = g->grayagain;
  g->grayagain = (GCObject *)0x0;
  g->gcstate = '\x02';
  if ((L->marked & 0x18) != 0) {
    reallymarkobject(g,(GCObject *)L);
  }
  if ((((g->l_registry).tt_ & 0x40) != 0) &&
     (pGVar2 = (g->l_registry).value_.gc, (pGVar2->marked & 0x18) != 0)) {
    reallymarkobject(g,pGVar2);
  }
  markmt(g);
  if (g->gray == (GCObject *)0x0) {
    lVar6 = 0;
  }
  else {
    lVar6 = 0;
    do {
      lVar3 = propagatemark(g);
      lVar6 = lVar6 + lVar3;
    } while (g->gray != (GCObject *)0x0);
  }
  plVar4 = g->twups;
  uVar12 = 0;
  if (plVar4 != (lua_State *)0x0) {
    pplVar10 = &g->twups;
    do {
      uVar12 = (ulong)((int)uVar12 + 1);
      if (((plVar4->marked & 0x18) == 0) && (plVar4->openupval != (UpVal *)0x0)) {
        pplVar10 = &plVar4->twups;
      }
      else {
        *pplVar10 = plVar4->twups;
        plVar4->twups = plVar4;
        for (pUVar8 = plVar4->openupval; pUVar8 != (UpVal *)0x0; pUVar8 = (pUVar8->u).open.next) {
          if ((((pUVar8->marked & 0x18) == 0) && ((((pUVar8->v).p)->tt_ & 0x40) != 0)) &&
             (pGVar2 = (((pUVar8->v).p)->value_).gc, (pGVar2->marked & 0x18) != 0)) {
            reallymarkobject(g,pGVar2);
          }
          uVar12 = (ulong)((int)uVar12 + 1);
        }
      }
      plVar4 = *pplVar10;
    } while (plVar4 != (lua_State *)0x0);
    uVar12 = (ulong)(int)uVar12;
  }
  if (g->gray == (GCObject *)0x0) {
    lVar11 = 0;
  }
  else {
    lVar11 = 0;
    do {
      lVar3 = propagatemark(g);
      lVar11 = lVar11 + lVar3;
    } while (g->gray != (GCObject *)0x0);
  }
  g->gray = pGVar1;
  if (pGVar1 == (GCObject *)0x0) {
    lVar7 = 0;
  }
  else {
    lVar7 = 0;
    do {
      lVar3 = propagatemark(g);
      lVar7 = lVar7 + lVar3;
    } while (g->gray != (GCObject *)0x0);
  }
  convergeephemerons(g);
  lVar9 = 0;
  clearbyvalues(g,g->weak,(GCObject *)0x0);
  clearbyvalues(g,g->allweak,(GCObject *)0x0);
  pGVar1 = g->weak;
  pGVar2 = g->allweak;
  separatetobefnz(g,0);
  lVar3 = markbeingfnz(g);
  if (g->gray != (GCObject *)0x0) {
    lVar9 = 0;
    do {
      lVar5 = propagatemark(g);
      lVar9 = lVar9 + lVar5;
    } while (g->gray != (GCObject *)0x0);
  }
  convergeephemerons(g);
  clearbykeys(g,g->ephemeron);
  clearbykeys(g,g->allweak);
  clearbyvalues(g,g->weak,pGVar1);
  clearbyvalues(g,g->allweak,pGVar2);
  luaS_clearcache(g);
  g->currentwhite = g->currentwhite ^ 0x18;
  return lVar11 + lVar7 + lVar6 + uVar12 + lVar3 + lVar9;
}

Assistant:

static lu_mem atomic (lua_State *L) {
  global_State *g = G(L);
  lu_mem work = 0;
  GCObject *origweak, *origall;
  GCObject *grayagain = g->grayagain;  /* save original list */
  g->grayagain = NULL;
  lua_assert(g->ephemeron == NULL && g->weak == NULL);
  lua_assert(!iswhite(g->mainthread));
  g->gcstate = GCSatomic;
  markobject(g, L);  /* mark running thread */
  /* registry and global metatables may be changed by API */
  markvalue(g, &g->l_registry);
  markmt(g);  /* mark global metatables */
  work += propagateall(g);  /* empties 'gray' list */
  /* remark occasional upvalues of (maybe) dead threads */
  work += remarkupvals(g);
  work += propagateall(g);  /* propagate changes */
  g->gray = grayagain;
  work += propagateall(g);  /* traverse 'grayagain' list */
  convergeephemerons(g);
  /* at this point, all strongly accessible objects are marked. */
  /* Clear values from weak tables, before checking finalizers */
  clearbyvalues(g, g->weak, NULL);
  clearbyvalues(g, g->allweak, NULL);
  origweak = g->weak; origall = g->allweak;
  separatetobefnz(g, 0);  /* separate objects to be finalized */
  work += markbeingfnz(g);  /* mark objects that will be finalized */
  work += propagateall(g);  /* remark, to propagate 'resurrection' */
  convergeephemerons(g);
  /* at this point, all resurrected objects are marked. */
  /* remove dead objects from weak tables */
  clearbykeys(g, g->ephemeron);  /* clear keys from all ephemeron tables */
  clearbykeys(g, g->allweak);  /* clear keys from all 'allweak' tables */
  /* clear values from resurrected weak tables */
  clearbyvalues(g, g->weak, origweak);
  clearbyvalues(g, g->allweak, origall);
  luaS_clearcache(g);
  g->currentwhite = cast_byte(otherwhite(g));  /* flip current white */
  lua_assert(g->gray == NULL);
  return work;  /* estimate of slots marked by 'atomic' */
}